

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O1

int __thiscall
CVmFormatterLog::open_log_file(CVmFormatterLog *this,vm_val_t *filespec,vm_rcdesc *rc)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  long lVar3;
  void *pvVar4;
  int iVar5;
  CVmNetFile *nf;
  vm_globalvar_t *pvVar6;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  uint local_110 [2];
  long local_108;
  void *local_100;
  __jmp_buf_tag local_f8;
  undefined4 extraout_var;
  
  G_err_frame::__tls_init();
  local_108 = *in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)local_110;
  local_110[0] = _setjmp(&local_f8);
  if (local_110[0] == 0) {
    iVar5 = CVmNetFile::open((char *)filespec,(int)rc,0xe,2,"text/plain");
    nf = (CVmNetFile *)CONCAT44(extraout_var,iVar5);
    CVmObjFile::check_safety_for_open(nf,2);
  }
  else {
    nf = (CVmNetFile *)0x0;
  }
  if ((local_110[0] == 1) && (local_110[0] = 2, nf != (CVmNetFile *)0x0)) {
    CVmNetFile::abandon(nf);
    err_rethrow();
  }
  lVar3 = local_108;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = lVar3;
  if ((local_110[0] & 0x4001) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pvVar4 = local_100;
    G_err_frame::__tls_init();
    *(void **)(*in_FS_OFFSET + 0x10) = pvVar4;
    err_rethrow();
  }
  if ((local_110[0] & 2) != 0) {
    free(local_100);
  }
  iVar5 = open_log_file(this,nf);
  if (iVar5 == 0) {
    if (this->logglob_ == (vm_globalvar_t *)0x0) {
      pvVar6 = CVmObjTable::create_global_var(&G_obj_table_X);
      this->logglob_ = pvVar6;
    }
    pvVar6 = this->logglob_;
    uVar2 = *(undefined4 *)&filespec->field_0x4;
    aVar1 = filespec->val;
    (pvVar6->val).typ = filespec->typ;
    *(undefined4 *)&(pvVar6->val).field_0x4 = uVar2;
    (pvVar6->val).val = aVar1;
  }
  return iVar5;
}

Assistant:

int CVmFormatterLog::open_log_file(VMG_ const vm_val_t *filespec,
                                   const struct vm_rcdesc *rc)
{
    CVmNetFile *nf = 0;
    err_try
    {
        /* create the network file descriptor */
        nf = CVmNetFile::open(vmg_ filespec, rc,
                              NETF_NEW, OSFTLOG, "text/plain");

        /* validate file safety */
        CVmObjFile::check_safety_for_open(vmg_ nf, VMOBJFILE_ACCESS_WRITE);
    }